

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.cpp
# Opt level: O0

void __thiscall
CaPS_SA::Suffix_Array<unsigned_long>::merge
          (Suffix_Array<unsigned_long> *this,idx_t_conflict *X,idx_t_conflict len_x,
          idx_t_conflict *Y,idx_t_conflict len_y,idx_t_conflict *LCP_x,idx_t_conflict *LCP_y,
          idx_t_conflict *Z,idx_t_conflict *LCP_z)

{
  unsigned_long *puVar1;
  idx_t_conflict iVar2;
  char *pcVar3;
  unsigned_long *in_RCX;
  ulong in_RDX;
  unsigned_long *in_RSI;
  long *in_RDI;
  ulong in_R8;
  unsigned_long *in_R9;
  unsigned_long *in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  idx_t_conflict n;
  idx_t_conflict context;
  idx_t_conflict max_n;
  idx_t_conflict k;
  idx_t_conflict j;
  idx_t_conflict i;
  idx_t_conflict l_x;
  idx_t_conflict m;
  char *local_a8;
  unsigned_long in_stack_ffffffffffffff68;
  char *y;
  char *local_60;
  ulong local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  char *local_40;
  char *local_38;
  unsigned_long *local_30;
  ulong local_28;
  unsigned_long *local_20;
  ulong local_18;
  unsigned_long *local_10 [2];
  
  local_38 = (char *)0x0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10[0] = in_RSI;
  while (local_48 < local_18 && local_50 < local_28) {
    local_40 = (char *)local_30[local_48];
    if (local_38 < local_40) {
      *(unsigned_long *)(in_stack_00000010 + local_58 * 8) = local_10[0][local_48];
      *(char **)(in_stack_00000018 + local_58 * 8) = local_40;
    }
    else if (local_40 < local_38) {
      *(unsigned_long *)(in_stack_00000010 + local_58 * 8) = local_20[local_50];
      *(char **)(in_stack_00000018 + local_58 * 8) = local_38;
      local_38 = local_40;
    }
    else {
      y = (char *)in_RDI[1];
      puVar1 = std::max<unsigned_long>(local_10[0] + local_48,local_20 + local_50);
      local_60 = y + -*puVar1;
      std::min<unsigned_long>((unsigned_long *)(in_RDI + 7),(unsigned_long *)&local_60);
      pcVar3 = local_38;
      iVar2 = LCP<8ul>(local_38,y,in_stack_ffffffffffffff68);
      pcVar3 = pcVar3 + iVar2;
      if (pcVar3 == local_60) {
        puVar1 = std::max<unsigned_long>(local_10[0] + local_48,local_20 + local_50);
        in_stack_ffffffffffffff68 = *puVar1;
      }
      else if (pcVar3[*in_RDI + local_10[0][local_48]] < pcVar3[*in_RDI + local_20[local_50]]) {
        in_stack_ffffffffffffff68 = local_10[0][local_48];
      }
      else {
        in_stack_ffffffffffffff68 = local_20[local_50];
      }
      *(unsigned_long *)(in_stack_00000010 + local_58 * 8) = in_stack_ffffffffffffff68;
      if (*(unsigned_long *)(in_stack_00000010 + local_58 * 8) == local_10[0][local_48]) {
        local_a8 = local_40;
      }
      else {
        local_a8 = local_38;
      }
      *(char **)(in_stack_00000018 + local_58 * 8) = local_a8;
      local_38 = pcVar3;
    }
    if (*(unsigned_long *)(in_stack_00000010 + local_58 * 8) == local_10[0][local_48]) {
      local_48 = local_48 + 1;
    }
    else {
      local_50 = local_50 + 1;
      std::swap<unsigned_long_const*>(local_10,&local_20);
      std::swap<unsigned_long>(&local_18,&local_28);
      std::swap<unsigned_long_const*>(&local_30,&stack0x00000008);
      std::swap<unsigned_long>(&local_48,&local_50);
    }
    local_58 = local_58 + 1;
  }
  memcpy((void *)(in_stack_00000010 + local_58 * 8),local_10[0] + local_48,(local_18 - local_48) * 8
        );
  memcpy((void *)(in_stack_00000018 + local_58 * 8),local_30 + local_48,(local_18 - local_48) * 8);
  memcpy((void *)(in_stack_00000010 + local_58 * 8),local_20 + local_50,(local_28 - local_50) * 8);
  memcpy((void *)(in_stack_00000018 + local_58 * 8),in_stack_00000008 + local_50,
         (local_28 - local_50) * 8);
  if (local_58 < local_18 + local_28) {
    *(char **)(in_stack_00000018 + local_58 * 8) = local_38;
  }
  return;
}

Assistant:

void Suffix_Array<T_idx_>::merge(const idx_t* X, idx_t len_x, const idx_t* Y, idx_t len_y, const idx_t* LCP_x, const idx_t* LCP_y, idx_t* Z, idx_t* LCP_z) const
{
    idx_t m = 0;    // LCP of the last compared pair.
    idx_t l_x;  // LCP(X_i, X_{i - 1}).
    idx_t i = 0;    // Index into `X`.
    idx_t j = 0;    // Index into `Y`.
    idx_t k = 0;    // Index into `Z`.

    while(i < len_x && j < len_y)
    {
        l_x = LCP_x[i];

        if(l_x > m)
            Z[k] = X[i],
            LCP_z[k] = l_x,
            m = m;
        else if(l_x < m)
            Z[k] = Y[j],
            LCP_z[k] = m,
            m = l_x;
        else    // Compute LCP of X_i and Y_j through linear scan.
        {
            const idx_t max_n = n_ - std::max(X[i], Y[j]);  // Length of the shorter suffix.
            const idx_t context = std::min(max_context, max_n); // Prefix-context length for the suffixes.
            const idx_t n = m + LCP(T_ + (X[i] + m), T_ + (Y[j] + m), context - m); // LCP(X_i, Y_j)

            // Whether the shorter suffix is a prefix of the longer one.
            Z[k] = (n == max_n ?    std::max(X[i], Y[j]) :
                                    (T_[X[i] + n] < T_[Y[j] + n] ? X[i] : Y[j]));
            LCP_z[k] = (Z[k] == X[i] ? l_x : m);
            m = n;
        }


        if(Z[k] == X[i])
            i++;
        else    // Swap X and Y (and associated data structures) when Y_j gets pulled into Z.
        {
            j++;
            std::swap(X, Y),
            std::swap(len_x, len_y),
            std::swap(LCP_x, LCP_y),
            std::swap(i, j);
        }

        k++;
    }


    // Copy rest of the data from X to Z.
    std::memcpy(Z + k, X + i, (len_x - i) * sizeof(idx_t));
    std::memcpy(LCP_z + k, LCP_x + i, (len_x - i) * sizeof(idx_t));

    // Copy rest of the data from Y to Z.
    std::memcpy(Z + k, Y + j, (len_y - j) * sizeof(idx_t));
    std::memcpy(LCP_z + k, LCP_y + j, (len_y - j) * sizeof(idx_t));

    // Fix first copied LCP.
    if(k < len_x + len_y)   // Both collections should not be empty.
        LCP_z[k] = m;
}